

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImGuiItemStatusFlags IVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 frame_padding_local;
  ImVec2 unsaved_marker_pos;
  ImVec2 local_80;
  ImDrawList *local_78;
  ImVec2 label_size;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar10 = GImGui;
  bVar11 = false;
  frame_padding_local = frame_padding;
  local_78 = draw_list;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar14 = (bb->Min).x;
  fVar13 = (bb->Max).x;
  if (1.0 < fVar13 - fVar14) {
    fVar14 = fVar14 + frame_padding_local.x;
    fVar1 = (bb->Max).y;
    fVar15 = (bb->Min).y + frame_padding_local.y;
    fVar13 = fVar13 - frame_padding_local.x;
    if ((flags & 1U) != 0) {
      IVar3 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar13 = fVar13 - IVar3.x;
      unsaved_marker_pos.x = (bb->Min).x + frame_padding_local.x + label_size.x + 2.0;
      if (fVar13 <= unsaved_marker_pos.x) {
        unsaved_marker_pos.x = fVar13;
      }
      unsaved_marker_pos.y =
           (float)(int)(pIVar10->FontSize * -0.25) + (bb->Min).y + frame_padding_local.y;
      local_40.y = (bb->Max).y - frame_padding_local.y;
      local_40.x = (bb->Max).x - frame_padding_local.x;
      local_38.x = 0.0;
      local_38.y = 0.0;
      RenderTextClippedEx(local_78,&unsaved_marker_pos,&local_40,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_38,(ImRect *)0x0);
    }
    if ((close_button_id == 0) ||
       ((pIVar10->HoveredId != close_button_id && pIVar10->HoveredId != tab_id &&
        (pIVar10->ActiveId != close_button_id)))) {
      bVar7 = false;
    }
    else {
      bVar7 = true;
    }
    unsaved_marker_pos.x = fVar14;
    unsaved_marker_pos.y = fVar15;
    local_80.x = fVar13;
    local_80.y = fVar1;
    if (bVar7) {
      pIVar2 = GImGui->CurrentWindow;
      IVar8 = (pIVar2->DC).LastItemId;
      IVar9 = (pIVar2->DC).LastItemStatusFlags;
      IVar3 = (pIVar2->DC).LastItemRect.Min;
      IVar4 = (pIVar2->DC).LastItemRect.Max;
      IVar5 = (pIVar2->DC).LastItemDisplayRect.Min;
      IVar6 = (pIVar2->DC).LastItemDisplayRect.Max;
      fVar14 = pIVar10->FontSize;
      PushStyleVar(10,&frame_padding_local);
      local_40.y = (bb->Min).y;
      local_40.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar14;
      bVar11 = CloseButton(close_button_id,&local_40);
      PopStyleVar(1);
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = IVar8;
      (pIVar2->DC).LastItemStatusFlags = IVar9;
      (pIVar2->DC).LastItemRect.Min = IVar3;
      (pIVar2->DC).LastItemRect.Max = IVar4;
      (pIVar2->DC).LastItemDisplayRect.Min = IVar5;
      (pIVar2->DC).LastItemDisplayRect.Max = IVar6;
      if ((flags & 4U) == 0) {
        bVar12 = IsMouseClicked(2,false);
        bVar11 = bVar11 || bVar12;
      }
      fVar13 = fVar13 - fVar14;
    }
    else {
      bVar11 = false;
    }
    fVar14 = fVar13;
    if (!bVar7) {
      fVar14 = (bb->Max).x + -1.0;
    }
    RenderTextEllipsis(local_78,&unsaved_marker_pos,&local_80,fVar13,fVar14,label,(char *)0x0,
                       &label_size);
  }
  return bVar11;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + (float)(int)(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

    return close_button_pressed;
}